

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_39::findThisHandle
          (anon_unknown_39 *this,Scope *scope,bitmask<slang::ast::LookupFlags> flags,
          SourceRange range,LookupResult *result)

{
  int iVar1;
  SymbolKind SVar2;
  int *piVar3;
  SubroutineSymbol *sub;
  anon_unknown_39 *paVar4;
  Symbol *pSVar5;
  undefined4 in_register_00000014;
  Scope *pSVar6;
  SourceRange sourceRange;
  
  sourceRange.startLoc._4_4_ = in_register_00000014;
  sourceRange.startLoc._0_4_ = flags.m_bits;
  paVar4 = this;
  pSVar6 = (Scope *)this;
  if (((uint)scope >> 0xc & 1) == 0) {
    while( true ) {
      piVar3 = *(int **)(paVar4 + 8);
      iVar1 = *piVar3;
      if ((iVar1 != 0x3a) && (iVar1 != 0x59)) break;
      paVar4 = *(anon_unknown_39 **)(piVar3 + 8);
    }
    if (iVar1 == 0x16) {
      if (((uint)scope >> 0xb & 1) == 0) {
        return *(Symbol **)(piVar3 + 0x22);
      }
    }
    else {
      if (iVar1 == 0x40) {
        pSVar5 = *(Symbol **)(piVar3 + 0x36);
      }
      else {
        if (iVar1 != 0x48) goto LAB_0029e53f;
        pSVar5 = *(Symbol **)(piVar3 + 0x1e);
      }
      if (pSVar5 != (Symbol *)0x0) {
        return pSVar5;
      }
    }
  }
  else {
    do {
      pSVar5 = pSVar6->thisSym;
      SVar2 = pSVar5->kind;
      if (SVar2 == ClassType) {
        return pSVar5;
      }
      if (SVar2 == InstanceBody) goto LAB_0029e53f;
      pSVar6 = pSVar5->parentScope;
    } while (pSVar5->parentScope != (Scope *)0x0);
    if (SVar2 == ClassType) {
      return pSVar5;
    }
  }
LAB_0029e53f:
  sourceRange.endLoc = range.startLoc;
  LookupResult::addDiag((LookupResult *)range.endLoc,(Scope *)this,(DiagCode)0x16000a,sourceRange);
  return (Symbol *)0x0;
}

Assistant:

const Symbol* findThisHandle(const Scope& scope, bitmask<LookupFlags> flags, SourceRange range,
                             LookupResult& result) {
    if (flags.has(LookupFlags::TypeReference)) {
        // type(this) is allowed to work anywhere within a class, regardless of whether
        // it's a static context or not.
        auto parent = &scope.asSymbol();
        while (parent->kind != SymbolKind::ClassType && parent->kind != SymbolKind::InstanceBody) {
            auto parentScope = parent->getParentScope();
            if (!parentScope)
                break;
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::ClassType)
            return &parent->as<ClassType>();
    }
    else {
        // Find the parent method, if we can.
        const Symbol* parent = &scope.asSymbol();
        while (parent->kind == SymbolKind::StatementBlock ||
               parent->kind == SymbolKind::RandSeqProduction) {
            auto parentScope = parent->getParentScope();
            SLANG_ASSERT(parentScope);
            parent = &parentScope->asSymbol();
        }

        if (parent->kind == SymbolKind::Subroutine) {
            auto& sub = parent->as<SubroutineSymbol>();
            if (sub.thisVar)
                return sub.thisVar;
        }
        else if (parent->kind == SymbolKind::ConstraintBlock) {
            auto thisVar = parent->as<ConstraintBlockSymbol>().thisVar;
            if (thisVar)
                return thisVar;
        }
        else if (parent->kind == SymbolKind::ClassType &&
                 !flags.has(LookupFlags::StaticInitializer)) {
            return parent->as<ClassType>().thisVar;
        }
    }

    result.addDiag(scope, diag::InvalidThisHandle, range);
    return nullptr;
}